

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

Symbol * slang::ast::GenericClassDefSymbol::fromSyntax(Scope *scope,ClassDeclarationSyntax *syntax)

{
  Compilation *pCVar1;
  GenericClassDefSymbol *pGVar2;
  SourceLocation local_40;
  string_view local_38;
  
  pCVar1 = scope->compilation;
  local_38 = parsing::Token::valueText(&syntax->name);
  local_40 = parsing::Token::location(&syntax->name);
  pGVar2 = TypedBumpAllocator<slang::ast::GenericClassDefSymbol>::
           emplace<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&pCVar1->genericClassAllocator,&local_38,&local_40);
  (pGVar2->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  if ((syntax->virtualOrInterface).kind == InterfaceKeyword) {
    pGVar2->isInterface = true;
  }
  ParameterBuilder::createDecls
            (scope,syntax->parameters,
             &(pGVar2->paramDecls).
              super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>);
  return &pGVar2->super_Symbol;
}

Assistant:

const Symbol& GenericClassDefSymbol::fromSyntax(const Scope& scope,
                                                const ClassDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.allocGenericClass(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);

    if (syntax.virtualOrInterface.kind == TokenKind::InterfaceKeyword)
        result->isInterface = true;

    // Extract information about parameters and save it for later use
    // when building specializations.
    SLANG_ASSERT(syntax.parameters);
    ParameterBuilder::createDecls(scope, *syntax.parameters, result->paramDecls);

    return *result;
}